

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_linkingToUnitsInAnotherModelReturnsUnlinked_Test::
~Units_linkingToUnitsInAnotherModelReturnsUnlinked_Test
          (Units_linkingToUnitsInAnotherModelReturnsUnlinked_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, linkingToUnitsInAnotherModelReturnsUnlinked)
{
    auto m1 = libcellml::Model::create("m1");
    auto m2 = libcellml::Model::create("m2");
    auto c1 = libcellml::Component::create("c1");
    auto u1 = libcellml::Units::create("u1");
    auto v1 = libcellml::Variable::create("v1");
    auto v2 = libcellml::Variable::create("v2");

    c1->addVariable(v1);
    c1->addVariable(v2);
    m1->addComponent(c1);
    v1->setUnits(u1);
    v2->setUnits("second");

    m2->addUnits(u1); // Units assigned to v1 exist in a different model.

    EXPECT_FALSE(m1->linkUnits());
    EXPECT_TRUE(m1->hasUnlinkedUnits());
}